

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_bind.cpp
# Opt level: O3

void C_NameKeys(char *str,int first,int second)

{
  size_t sVar1;
  char *pcVar2;
  
  *str = '\0';
  if (first == 0) {
    if (second == 0) {
      return;
    }
  }
  else {
    pcVar2 = KeyNames[first];
    if (pcVar2 == (char *)0x0) {
      pcVar2 = &KeyName(int)::name;
      mysnprintf(&KeyName(int)::name,5,"Key_%d",first);
    }
    strcpy(str,pcVar2);
    if (second == 0) {
      return;
    }
    sVar1 = strlen(str);
    builtin_strncpy(str + sVar1," or ",5);
  }
  pcVar2 = KeyNames[second];
  if (pcVar2 == (char *)0x0) {
    pcVar2 = &KeyName(int)::name;
    mysnprintf(&KeyName(int)::name,5,"Key_%d",(ulong)(uint)second);
  }
  strcat(str,pcVar2);
  return;
}

Assistant:

void C_NameKeys (char *str, int first, int second)
{
	int c = 0;

	*str = 0;
	if (first)
	{
		c++;
		strcpy (str, KeyName (first));
		if (second)
			strcat (str, " or ");
	}

	if (second)
	{
		c++;
		strcat (str, KeyName (second));
	}

	if (!c)
		*str = '\0';
}